

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O1

bool __thiscall FIX::FileStore::get(FileStore *this,SEQNUM msgSeqNum,string *msg)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  int iVar3;
  char *__s;
  _Base_ptr p_Var4;
  IOException *pIVar5;
  _Base_ptr p_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var1 = &(this->m_offsets)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->m_offsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < msgSeqNum])
  {
    if (*(ulong *)(p_Var6 + 1) >= msgSeqNum) {
      p_Var4 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var6 = p_Var4, msgSeqNum < *(ulong *)(p_Var4 + 1))
     ) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    iVar3 = fseek((FILE *)this->m_msgFile,(long)p_Var6[1]._M_parent,0);
    if (iVar3 != 0) {
      pIVar5 = (IOException *)__cxa_allocate_exception(0x50);
      std::operator+(&local_50,"Unable to seek in file ",&this->m_msgFileName);
      IOException::IOException(pIVar5,&local_50);
      __cxa_throw(pIVar5,&IOException::typeinfo,FIX::Exception::~Exception);
    }
    __s = (char *)operator_new__((ulong)((long)&(p_Var6[1]._M_left)->_M_color + 1));
    p_Var4 = (_Base_ptr)fread(__s,1,(size_t)p_Var6[1]._M_left,(FILE *)this->m_msgFile);
    iVar3 = ferror((FILE *)this->m_msgFile);
    if ((iVar3 != 0) || (p_Var4 != p_Var6[1]._M_left)) {
      operator_delete__(__s);
      pIVar5 = (IOException *)__cxa_allocate_exception(0x50);
      std::operator+(&local_50,"Unable to read from file ",&this->m_msgFileName);
      IOException::IOException(pIVar5,&local_50);
      __cxa_throw(pIVar5,&IOException::typeinfo,FIX::Exception::~Exception);
    }
    __s[(long)p_Var6[1]._M_left] = '\0';
    pcVar2 = (char *)msg->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)msg,0,pcVar2,(ulong)__s);
    operator_delete__(__s);
  }
  return (_Rb_tree_header *)p_Var6 != p_Var1;
}

Assistant:

EXCEPT(IOException) {
  NumToOffset::const_iterator find = m_offsets.find(msgSeqNum);
  if (find == m_offsets.end()) {
    return false;
  }
  const OffsetSize &offset = find->second;
  if (fseek(m_msgFile, offset.first, SEEK_SET)) {
    throw IOException("Unable to seek in file " + m_msgFileName);
  }
  char *buffer = new char[offset.second + 1];
  size_t result = fread(buffer, sizeof(char), offset.second, m_msgFile);
  if (ferror(m_msgFile) || result != (size_t)offset.second) {
    delete[] buffer;
    throw IOException("Unable to read from file " + m_msgFileName);
  }
  buffer[offset.second] = 0;
  msg = buffer;
  delete[] buffer;
  return true;
}